

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O0

Aig_Obj_t * Aig_And(Aig_Man_t *p,Aig_Obj_t *p0,Aig_Obj_t *p1)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *local_80;
  Aig_Obj_t *local_78;
  Aig_Obj_t *pFanD;
  Aig_Obj_t *pFanC;
  Aig_Obj_t *pFanB;
  Aig_Obj_t *pFanA;
  Aig_Obj_t *pFan1;
  Aig_Obj_t *pFan0;
  Aig_Obj_t *pResult;
  Aig_Obj_t *pGhost;
  Aig_Obj_t *p1_local;
  Aig_Obj_t *p0_local;
  Aig_Man_t *p_local;
  
  if (p0 == p1) {
    return p0;
  }
  pGhost = p1;
  p1_local = p0;
  p0_local = (Aig_Obj_t *)p;
  pAVar2 = Aig_Not(p1);
  if (p0 == pAVar2) {
    pAVar2 = Aig_Not(p0_local[1].field_0.pNext);
    return pAVar2;
  }
  pAVar2 = Aig_Regular(p1_local);
  if (pAVar2 == p0_local[1].field_0.pNext) {
    if (p1_local == p0_local[1].field_0.pNext) {
      local_78 = pGhost;
    }
    else {
      local_78 = Aig_Not(p0_local[1].field_0.pNext);
    }
    return local_78;
  }
  pAVar2 = Aig_Regular(pGhost);
  if (pAVar2 == p0_local[1].field_0.pNext) {
    if (pGhost == p0_local[1].field_0.pNext) {
      local_80 = p1_local;
    }
    else {
      local_80 = Aig_Not(p0_local[1].field_0.pNext);
    }
    return local_80;
  }
  if (p0_local[6].TravId != 0) {
    pAVar2 = Aig_Regular(p1_local);
    iVar1 = Aig_ObjIsNode(pAVar2);
    if (iVar1 == 0) {
      pAVar2 = Aig_Regular(pGhost);
      iVar1 = Aig_ObjIsNode(pAVar2);
      if (iVar1 == 0) goto LAB_0089ac41;
    }
    pAVar2 = Aig_Regular(p1_local);
    pAVar2 = Aig_ObjChild0(pAVar2);
    pAVar3 = Aig_Regular(p1_local);
    pAVar3 = Aig_ObjChild1(pAVar3);
    pAVar4 = Aig_Regular(pGhost);
    pAVar4 = Aig_ObjChild0(pAVar4);
    pAVar5 = Aig_Regular(pGhost);
    pAVar5 = Aig_ObjChild1(pAVar5);
    iVar1 = Aig_IsComplement(p1_local);
    if (iVar1 == 0) {
      pAVar6 = Aig_Not(pGhost);
      if ((pAVar2 == pAVar6) || (pAVar6 = Aig_Not(pGhost), pAVar3 == pAVar6)) {
        pAVar2 = Aig_Not(p0_local[1].field_0.pNext);
        return pAVar2;
      }
      if ((pAVar2 == pGhost) || (pAVar3 == pGhost)) {
        return p1_local;
      }
    }
    else {
      pAVar6 = Aig_Not(pGhost);
      if ((pAVar2 == pAVar6) || (pAVar7 = Aig_Not(pGhost), pAVar6 = p0_local, pAVar3 == pAVar7)) {
        return pGhost;
      }
      if (pAVar3 == pGhost) {
        pAVar2 = Aig_Not(pAVar2);
        pAVar2 = Aig_And((Aig_Man_t *)pAVar6,pAVar2,pAVar3);
        return pAVar2;
      }
      if (pAVar2 == pGhost) {
        pAVar3 = Aig_Not(pAVar3);
        pAVar2 = Aig_And((Aig_Man_t *)pAVar6,pAVar3,pAVar2);
        return pAVar2;
      }
    }
    iVar1 = Aig_IsComplement(pGhost);
    if (iVar1 == 0) {
      pAVar6 = Aig_Not(p1_local);
      if ((pAVar4 == pAVar6) || (pAVar6 = Aig_Not(p1_local), pAVar5 == pAVar6)) {
        pAVar2 = Aig_Not(p0_local[1].field_0.pNext);
        return pAVar2;
      }
      if ((pAVar4 == p1_local) || (pAVar5 == p1_local)) {
        return pGhost;
      }
    }
    else {
      pAVar6 = Aig_Not(p1_local);
      if ((pAVar4 == pAVar6) || (pAVar7 = Aig_Not(p1_local), pAVar6 = p0_local, pAVar5 == pAVar7)) {
        return p1_local;
      }
      if (pAVar5 == p1_local) {
        pAVar2 = Aig_Not(pAVar4);
        pAVar2 = Aig_And((Aig_Man_t *)pAVar6,pAVar2,pAVar5);
        return pAVar2;
      }
      if (pAVar4 == p1_local) {
        pAVar2 = Aig_Not(pAVar5);
        pAVar2 = Aig_And((Aig_Man_t *)pAVar6,pAVar2,pAVar4);
        return pAVar2;
      }
    }
    iVar1 = Aig_IsComplement(p1_local);
    if ((iVar1 == 0) && (iVar1 = Aig_IsComplement(pGhost), iVar1 == 0)) {
      pAVar6 = Aig_Not(pAVar4);
      if ((((pAVar2 == pAVar6) || (pAVar6 = Aig_Not(pAVar5), pAVar2 == pAVar6)) ||
          (pAVar6 = Aig_Not(pAVar4), pAVar3 == pAVar6)) ||
         (pAVar6 = Aig_Not(pAVar5), pAVar3 == pAVar6)) {
        pAVar2 = Aig_Not(p0_local[1].field_0.pNext);
        return pAVar2;
      }
      if ((pAVar2 == pAVar4) || (pAVar3 == pAVar4)) {
        pAVar2 = Aig_And((Aig_Man_t *)p0_local,p1_local,pAVar5);
        return pAVar2;
      }
      if ((pAVar3 == pAVar4) || (pAVar3 == pAVar5)) {
        pAVar2 = Aig_And((Aig_Man_t *)p0_local,pAVar2,pGhost);
        return pAVar2;
      }
      if ((pAVar2 == pAVar5) || (pAVar3 == pAVar5)) {
        pAVar2 = Aig_And((Aig_Man_t *)p0_local,p1_local,pAVar4);
        return pAVar2;
      }
      if ((pAVar2 == pAVar4) || (pAVar2 == pAVar5)) {
        pAVar2 = Aig_And((Aig_Man_t *)p0_local,pAVar3,pGhost);
        return pAVar2;
      }
    }
    else {
      iVar1 = Aig_IsComplement(p1_local);
      if ((iVar1 == 0) || (iVar1 = Aig_IsComplement(pGhost), iVar1 != 0)) {
        iVar1 = Aig_IsComplement(p1_local);
        if ((iVar1 == 0) && (iVar1 = Aig_IsComplement(pGhost), iVar1 != 0)) {
          pAVar6 = Aig_Not(pAVar2);
          if ((((pAVar4 == pAVar6) || (pAVar6 = Aig_Not(pAVar3), pAVar4 == pAVar6)) ||
              (pAVar6 = Aig_Not(pAVar2), pAVar5 == pAVar6)) ||
             (pAVar7 = Aig_Not(pAVar3), pAVar6 = p0_local, pAVar5 == pAVar7)) {
            return p1_local;
          }
          if ((pAVar5 == pAVar2) || (pAVar5 == pAVar3)) {
            pAVar2 = Aig_Not(pAVar4);
            pAVar2 = Aig_And((Aig_Man_t *)pAVar6,pAVar2,p1_local);
            return pAVar2;
          }
          if ((pAVar4 == pAVar2) || (pAVar4 == pAVar3)) {
            pAVar2 = Aig_Not(pAVar5);
            pAVar2 = Aig_And((Aig_Man_t *)pAVar6,pAVar2,p1_local);
            return pAVar2;
          }
        }
        else {
          if ((pAVar2 == pAVar5) && (pAVar6 = Aig_Not(pAVar4), pAVar3 == pAVar6)) {
            pAVar2 = Aig_Not(pAVar2);
            return pAVar2;
          }
          if ((pAVar3 == pAVar4) && (pAVar6 = Aig_Not(pAVar5), pAVar2 == pAVar6)) {
            pAVar2 = Aig_Not(pAVar3);
            return pAVar2;
          }
          if ((pAVar2 == pAVar4) && (pAVar6 = Aig_Not(pAVar5), pAVar3 == pAVar6)) {
            pAVar2 = Aig_Not(pAVar2);
            return pAVar2;
          }
          if ((pAVar3 == pAVar5) && (pAVar4 = Aig_Not(pAVar4), pAVar2 == pAVar4)) {
            pAVar2 = Aig_Not(pAVar3);
            return pAVar2;
          }
        }
      }
      else {
        pAVar6 = Aig_Not(pAVar4);
        if ((((pAVar2 == pAVar6) || (pAVar6 = Aig_Not(pAVar5), pAVar2 == pAVar6)) ||
            (pAVar6 = Aig_Not(pAVar4), pAVar3 == pAVar6)) ||
           (pAVar7 = Aig_Not(pAVar5), pAVar6 = p0_local, pAVar3 == pAVar7)) {
          return pGhost;
        }
        if ((pAVar3 == pAVar4) || (pAVar3 == pAVar5)) {
          pAVar2 = Aig_Not(pAVar2);
          pAVar2 = Aig_And((Aig_Man_t *)pAVar6,pAVar2,pGhost);
          return pAVar2;
        }
        if ((pAVar2 == pAVar4) || (pAVar2 == pAVar5)) {
          pAVar2 = Aig_Not(pAVar3);
          pAVar2 = Aig_And((Aig_Man_t *)pAVar6,pAVar2,pGhost);
          return pAVar2;
        }
      }
    }
  }
LAB_0089ac41:
  if ((*(int *)&p0_local[6].field_0x1c == 0) ||
     (iVar1 = Aig_ObjIsExorType(p1_local,pGhost,&pFan1,&pFanA), iVar1 == 0)) {
    pResult = Aig_ObjCreateGhost((Aig_Man_t *)p0_local,p1_local,pGhost,AIG_OBJ_AND);
    pFan0 = Aig_TableLookup((Aig_Man_t *)p0_local,pResult);
    p_local = (Aig_Man_t *)pFan0;
    if ((Aig_Man_t *)pFan0 == (Aig_Man_t *)0x0) {
      p_local = (Aig_Man_t *)Aig_ObjCreate((Aig_Man_t *)p0_local,pResult);
    }
  }
  else {
    p_local = (Aig_Man_t *)Aig_Exor((Aig_Man_t *)p0_local,pFan1,pFanA);
  }
  return (Aig_Obj_t *)p_local;
}

Assistant:

Aig_Obj_t * Aig_And( Aig_Man_t * p, Aig_Obj_t * p0, Aig_Obj_t * p1 )
{
    Aig_Obj_t * pGhost, * pResult;
    Aig_Obj_t * pFan0, * pFan1;
    // check trivial cases
    if ( p0 == p1 )
        return p0;
    if ( p0 == Aig_Not(p1) )
        return Aig_Not(p->pConst1);
    if ( Aig_Regular(p0) == p->pConst1 )
        return p0 == p->pConst1 ? p1 : Aig_Not(p->pConst1);
    if ( Aig_Regular(p1) == p->pConst1 )
        return p1 == p->pConst1 ? p0 : Aig_Not(p->pConst1);
    // check not so trivial cases
    if ( p->fAddStrash && (Aig_ObjIsNode(Aig_Regular(p0)) || Aig_ObjIsNode(Aig_Regular(p1))) )
    { // http://fmv.jku.at/papers/BrummayerBiere-MEMICS06.pdf
        Aig_Obj_t * pFanA, * pFanB, * pFanC, * pFanD;
        pFanA = Aig_ObjChild0(Aig_Regular(p0));
        pFanB = Aig_ObjChild1(Aig_Regular(p0));
        pFanC = Aig_ObjChild0(Aig_Regular(p1));
        pFanD = Aig_ObjChild1(Aig_Regular(p1));
        if ( Aig_IsComplement(p0) )
        {
            if ( pFanA == Aig_Not(p1) || pFanB == Aig_Not(p1) )
                return p1;
            if ( pFanB == p1 )
                return Aig_And( p, Aig_Not(pFanA), pFanB );
            if ( pFanA == p1 )
                return Aig_And( p, Aig_Not(pFanB), pFanA );
        }
        else
        {
            if ( pFanA == Aig_Not(p1) || pFanB == Aig_Not(p1) )
                return Aig_Not(p->pConst1);
            if ( pFanA == p1 || pFanB == p1 )
                return p0;
        }
        if ( Aig_IsComplement(p1) )
        {
            if ( pFanC == Aig_Not(p0) || pFanD == Aig_Not(p0) )
                return p0;
            if ( pFanD == p0 )
                return Aig_And( p, Aig_Not(pFanC), pFanD );
            if ( pFanC == p0 )
                return Aig_And( p, Aig_Not(pFanD), pFanC );
        }
        else
        {
            if ( pFanC == Aig_Not(p0) || pFanD == Aig_Not(p0) )
                return Aig_Not(p->pConst1);
            if ( pFanC == p0 || pFanD == p0 )
                return p1;
        }
        if ( !Aig_IsComplement(p0) && !Aig_IsComplement(p1) ) 
        {
            if ( pFanA == Aig_Not(pFanC) || pFanA == Aig_Not(pFanD) || pFanB == Aig_Not(pFanC) || pFanB == Aig_Not(pFanD) )
                return Aig_Not(p->pConst1);
            if ( pFanA == pFanC || pFanB == pFanC )
                return Aig_And( p, p0, pFanD );
            if ( pFanB == pFanC || pFanB == pFanD )
                return Aig_And( p, pFanA, p1 );
            if ( pFanA == pFanD || pFanB == pFanD )
                return Aig_And( p, p0, pFanC );
            if ( pFanA == pFanC || pFanA == pFanD )
                return Aig_And( p, pFanB, p1 );
        }
        else if ( Aig_IsComplement(p0) && !Aig_IsComplement(p1) )
        {
            if ( pFanA == Aig_Not(pFanC) || pFanA == Aig_Not(pFanD) || pFanB == Aig_Not(pFanC) || pFanB == Aig_Not(pFanD) )
                return p1;
            if ( pFanB == pFanC || pFanB == pFanD )
                return Aig_And( p, Aig_Not(pFanA), p1 );
            if ( pFanA == pFanC || pFanA == pFanD )
                return Aig_And( p, Aig_Not(pFanB), p1 );
        }
        else if ( !Aig_IsComplement(p0) && Aig_IsComplement(p1) )
        {
            if ( pFanC == Aig_Not(pFanA) || pFanC == Aig_Not(pFanB) || pFanD == Aig_Not(pFanA) || pFanD == Aig_Not(pFanB) )
                return p0;
            if ( pFanD == pFanA || pFanD == pFanB )
                return Aig_And( p, Aig_Not(pFanC), p0 );
            if ( pFanC == pFanA || pFanC == pFanB )
                return Aig_And( p, Aig_Not(pFanD), p0 );
        }
        else // if ( Aig_IsComplement(p0) && Aig_IsComplement(p1) )
        {
            if ( pFanA == pFanD && pFanB == Aig_Not(pFanC) )
                return Aig_Not(pFanA);
            if ( pFanB == pFanC && pFanA == Aig_Not(pFanD) )
                return Aig_Not(pFanB);
            if ( pFanA == pFanC && pFanB == Aig_Not(pFanD) )
                return Aig_Not(pFanA);
            if ( pFanB == pFanD && pFanA == Aig_Not(pFanC) )
                return Aig_Not(pFanB);
        }
    }
    // check if it can be an EXOR gate
    if ( p->fCatchExor && Aig_ObjIsExorType( p0, p1, &pFan0, &pFan1 ) )
        return Aig_Exor( p, pFan0, pFan1 );
    pGhost = Aig_ObjCreateGhost( p, p0, p1, AIG_OBJ_AND );
    if ( (pResult = Aig_TableLookup( p, pGhost )) )
        return pResult;
    return Aig_ObjCreate( p, pGhost );
}